

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

int64_t duckdb::StringSliceOperations::ValueLength(string_t *value)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = *(ulong *)&value->value & 0xffffffff;
  if (uVar2 != 0) {
    uVar3 = 0;
    lVar1 = 0;
    do {
      lVar1 = lVar1 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    return lVar1;
  }
  return 0;
}

Assistant:

static int64_t ValueLength(const string_t &value) {
		return Length<string_t, int64_t>(value);
	}